

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiout.cpp
# Opt level: O3

int anon_unknown.dwarf_1ae12::RtMidiOut_ctor(lua_State *L)

{
  RtMidi *midi;
  string local_48;
  
  midi = (RtMidi *)lua_newuserdata(L,0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"RtMidi Output Client","");
  RtMidiOut::RtMidiOut((RtMidiOut *)midi,UNSPECIFIED,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  RtMidi_init(midi,L,-1);
  lua_getfield(L,0xffffd8f0,"luartmidi.rtmidiout");
  lua_setmetatable(L,0xfffffffe);
  return 1;
}

Assistant:

int RtMidiOut_ctor(lua_State *L) {
	auto midiout = reinterpret_cast<RtMidiOut *>(
	 lua_newuserdata(L, sizeof(RtMidiOut)));
	try {
		new (midiout) RtMidiOut { };
		RtMidi_init(*midiout, L, -1);
		luaL_getmetatable(L, MT_RTMIDIOUT);
		lua_setmetatable(L, -2);
		return 1;
	}
	catch (RtMidiError &err) {
		auto midierror = reinterpret_cast<RtMidiError *>(
		 lua_newuserdata(L, sizeof(RtMidiError)));
		new (midierror) RtMidiError {err};
		luaL_getmetatable(L, MT_RTMIDIERROR);
		lua_setmetatable(L, -2);
		return lua_error(L);
	}
}